

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaOf.c
# Opt level: O1

Of_Man_t * Of_StoCreate(Gia_Man_t *pGia,Jf_Par_t *pPars)

{
  int iVar1;
  uint uVar2;
  Vec_Int_t *pVVar3;
  Of_Man_t *p;
  Of_Obj_t *pOVar4;
  void **ppvVar5;
  int *piVar6;
  word *pEntry;
  Vec_Mem_t *p_00;
  abctime aVar7;
  uint uVar8;
  uint uVar9;
  timespec ts;
  timespec local_40;
  
  if (0x1e < pPars->nCutNum - 2U) {
    __assert_fail("pPars->nCutNum > 1 && pPars->nCutNum <= OF_CUT_MAX",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaOf.c"
                  ,0xd3,"Of_Man_t *Of_StoCreate(Gia_Man_t *, Jf_Par_t *)");
  }
  if (4 < pPars->nLutSize - 2U) {
    __assert_fail("pPars->nLutSize > 1 && pPars->nLutSize <= OF_LEAF_MAX",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaOf.c"
                  ,0xd4,"Of_Man_t *Of_StoCreate(Gia_Man_t *, Jf_Par_t *)");
  }
  if (pGia->pRefs != (int *)0x0) {
    free(pGia->pRefs);
    pGia->pRefs = (int *)0x0;
  }
  if (pGia->vCellMapping != (Vec_Int_t *)0x0) {
    piVar6 = pGia->vCellMapping->pArray;
    if (piVar6 != (int *)0x0) {
      free(piVar6);
      pGia->vCellMapping->pArray = (int *)0x0;
    }
    if (pGia->vCellMapping != (Vec_Int_t *)0x0) {
      free(pGia->vCellMapping);
      pGia->vCellMapping = (Vec_Int_t *)0x0;
    }
  }
  if (pGia->pSibls != (int *)0x0) {
    Gia_ManSetPhase(pGia);
  }
  if (pGia->pRefs != (int *)0x0) {
    free(pGia->pRefs);
    pGia->pRefs = (int *)0x0;
  }
  pVVar3 = (Vec_Int_t *)malloc(0x10);
  pVVar3->nCap = 0;
  pVVar3->nSize = 0;
  pVVar3->pArray = (int *)0x0;
  Mf_ManSetFlowRefs(pGia,pVVar3);
  piVar6 = pVVar3->pArray;
  pVVar3->nCap = 0;
  pVVar3->nSize = 0;
  pVVar3->pArray = (int *)0x0;
  pGia->pRefs = piVar6;
  if (pVVar3->pArray != (int *)0x0) {
    free(pVVar3->pArray);
    pVVar3->pArray = (int *)0x0;
  }
  free(pVVar3);
  p = (Of_Man_t *)calloc(1,0xb0);
  iVar1 = clock_gettime(3,&local_40);
  if (iVar1 < 0) {
    aVar7 = -1;
  }
  else {
    aVar7 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
  }
  p->clkStart = aVar7;
  p->pGia = pGia;
  p->pPars = pPars;
  pOVar4 = (Of_Obj_t *)calloc((long)pGia->nObjs,0x20);
  p->pObjs = pOVar4;
  p->iCur = 2;
  if ((p->vPages).nCap < 0x100) {
    ppvVar5 = (p->vPages).pArray;
    if (ppvVar5 == (void **)0x0) {
      ppvVar5 = (void **)malloc(0x800);
    }
    else {
      ppvVar5 = (void **)realloc(ppvVar5,0x800);
    }
    (p->vPages).pArray = ppvVar5;
    (p->vPages).nCap = 0x100;
  }
  uVar9 = pGia->nObjs;
  if ((p->vCutSets).nCap < (int)uVar9) {
    piVar6 = (p->vCutSets).pArray;
    if (piVar6 == (int *)0x0) {
      piVar6 = (int *)malloc((long)(int)uVar9 << 2);
    }
    else {
      piVar6 = (int *)realloc(piVar6,(long)(int)uVar9 << 2);
    }
    (p->vCutSets).pArray = piVar6;
    if (piVar6 == (int *)0x0) goto LAB_0074ef49;
    (p->vCutSets).nCap = uVar9;
  }
  if (0 < (int)uVar9) {
    memset((p->vCutSets).pArray,0,(ulong)uVar9 * 4);
  }
  (p->vCutSets).nSize = uVar9;
  uVar9 = pGia->nObjs;
  if ((p->vCutFlows).nCap < (int)uVar9) {
    piVar6 = (p->vCutFlows).pArray;
    if (piVar6 == (int *)0x0) {
      piVar6 = (int *)malloc((long)(int)uVar9 << 2);
    }
    else {
      piVar6 = (int *)realloc(piVar6,(long)(int)uVar9 << 2);
    }
    (p->vCutFlows).pArray = piVar6;
    if (piVar6 == (int *)0x0) goto LAB_0074ef49;
    (p->vCutFlows).nCap = uVar9;
  }
  if (0 < (int)uVar9) {
    memset((p->vCutFlows).pArray,0,(ulong)uVar9 * 4);
  }
  (p->vCutFlows).nSize = uVar9;
  uVar9 = pGia->nObjs;
  if ((p->vCutDelays).nCap < (int)uVar9) {
    piVar6 = (p->vCutDelays).pArray;
    if (piVar6 == (int *)0x0) {
      piVar6 = (int *)malloc((long)(int)uVar9 << 2);
    }
    else {
      piVar6 = (int *)realloc(piVar6,(long)(int)uVar9 << 2);
    }
    (p->vCutDelays).pArray = piVar6;
    if (piVar6 == (int *)0x0) goto LAB_0074ef49;
    (p->vCutDelays).nCap = uVar9;
  }
  if (0 < (int)uVar9) {
    memset((p->vCutDelays).pArray,0,(ulong)uVar9 * 4);
  }
  (p->vCutDelays).nSize = uVar9;
  if ((p->vCutRefs).nCap < 1000) {
    piVar6 = (p->vCutRefs).pArray;
    if (piVar6 == (int *)0x0) {
      piVar6 = (int *)malloc(4000);
    }
    else {
      piVar6 = (int *)realloc(piVar6,4000);
    }
    (p->vCutRefs).pArray = piVar6;
    if (piVar6 == (int *)0x0) {
LAB_0074ef49:
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                    ,0x215,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    (p->vCutRefs).nCap = 1000;
  }
  if (pPars->fCutMin != 0) {
    pEntry = (word *)malloc(8);
    p_00 = (Vec_Mem_t *)calloc(1,0x30);
    p_00->nEntrySize = 1;
    p_00->LogPageSze = 0xc;
    p_00->PageMask = 0xfff;
    p_00->iPage = -1;
    if ((p_00->vTable != (Vec_Int_t *)0x0) || (p_00->vNexts != (Vec_Int_t *)0x0)) {
      __assert_fail("p->vTable == NULL && p->vNexts == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecMem.h"
                    ,0x13b,"void Vec_MemHashAlloc(Vec_Mem_t *, int)");
    }
    uVar9 = 9999;
    while( true ) {
      do {
        uVar8 = uVar9;
        uVar9 = uVar8 + 1;
      } while ((uVar8 & 1) != 0);
      if (uVar9 < 9) break;
      iVar1 = 5;
      while (uVar9 % (iVar1 - 2U) != 0) {
        uVar2 = iVar1 * iVar1;
        iVar1 = iVar1 + 2;
        if (uVar9 < uVar2) goto LAB_0074ee49;
      }
    }
LAB_0074ee49:
    pVVar3 = (Vec_Int_t *)malloc(0x10);
    uVar2 = 0x10;
    if (0xe < uVar8) {
      uVar2 = uVar9;
    }
    pVVar3->nSize = 0;
    pVVar3->nCap = uVar2;
    piVar6 = (int *)malloc((long)(int)uVar2 << 2);
    pVVar3->pArray = piVar6;
    pVVar3->nSize = uVar9;
    if (piVar6 != (int *)0x0) {
      memset(piVar6,0xff,(long)(int)uVar9 << 2);
    }
    p_00->vTable = pVVar3;
    pVVar3 = (Vec_Int_t *)malloc(0x10);
    pVVar3->nCap = 10000;
    pVVar3->nSize = 0;
    piVar6 = (int *)malloc(40000);
    pVVar3->pArray = piVar6;
    p_00->vNexts = pVVar3;
    *pEntry = 0;
    iVar1 = Vec_MemHashInsert(p_00,pEntry);
    if (iVar1 != 0) {
      __assert_fail("Value == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecMem.h"
                    ,0x19e,"Vec_Mem_t *Vec_MemAllocForTT(int, int)");
    }
    *pEntry = 0xaaaaaaaaaaaaaaaa;
    iVar1 = Vec_MemHashInsert(p_00,pEntry);
    if (iVar1 != 1) {
      __assert_fail("Value == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecMem.h"
                    ,0x1a3,"Vec_Mem_t *Vec_MemAllocForTT(int, int)");
    }
    free(pEntry);
    p->vTtMem = p_00;
  }
  piVar6 = pGia->pRefs;
  pGia->pRefs = (int *)0x0;
  Of_ManAreaFlow(p);
  pGia->pRefs = piVar6;
  return p;
}

Assistant:

Of_Man_t * Of_StoCreate( Gia_Man_t * pGia, Jf_Par_t * pPars )
{
    extern void Mf_ManSetFlowRefs( Gia_Man_t * p, Vec_Int_t * vRefs );
    Of_Man_t * p;
    Vec_Int_t * vFlowRefs;
    int * pRefs = NULL;
    assert( pPars->nCutNum > 1  && pPars->nCutNum <= OF_CUT_MAX );
    assert( pPars->nLutSize > 1 && pPars->nLutSize <= OF_LEAF_MAX );
    ABC_FREE( pGia->pRefs );
    Vec_IntFreeP( &pGia->vCellMapping );
    if ( Gia_ManHasChoices(pGia) )
        Gia_ManSetPhase(pGia);
    // create references
    ABC_FREE( pGia->pRefs );
    vFlowRefs = Vec_IntAlloc(0);
    Mf_ManSetFlowRefs( pGia, vFlowRefs );
    pGia->pRefs= Vec_IntReleaseArray(vFlowRefs);
    Vec_IntFree(vFlowRefs);
    // create
    p = ABC_CALLOC( Of_Man_t, 1 );
    p->clkStart = Abc_Clock();
    p->pGia     = pGia;
    p->pPars    = pPars;
    p->pObjs    = ABC_CALLOC( Of_Obj_t, Gia_ManObjNum(pGia) );
    p->iCur     = 2;
    // other
    Vec_PtrGrow( &p->vPages, 256 );                                    // cut memory
    Vec_IntFill( &p->vCutSets,  Gia_ManObjNum(pGia), 0 );              // cut offsets
    Vec_IntFill( &p->vCutFlows, Gia_ManObjNum(pGia), 0 );              // cut area
    Vec_IntFill( &p->vCutDelays,Gia_ManObjNum(pGia), 0 );              // cut delay
    Vec_IntGrow( &p->vCutRefs,  1000 );                                // cut references
    if ( pPars->fCutMin )
        p->vTtMem = Vec_MemAllocForTT( 6, 0 );          
    // compute area flow
    pRefs = pGia->pRefs; pGia->pRefs = NULL;
    Of_ManAreaFlow( p );
    pGia->pRefs = pRefs;
    return p;
}